

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::HasSpell(Character *this,short spell)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  undefined2 in_register_00000032;
  list<Character_Spell,_std::allocator<Character_Spell>_> *plVar3;
  
  plVar3 = &this->spells;
  p_Var1 = (_List_node_base *)plVar3;
  do {
    p_Var1 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)&p_Var1->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    p_Var2 = (_List_node_base *)plVar3;
    if (p_Var1 == (_List_node_base *)plVar3) break;
    p_Var2 = p_Var1;
  } while ((int)*(short *)&p_Var1[1]._M_next != CONCAT22(in_register_00000032,spell));
  return p_Var2 != (_List_node_base *)plVar3;
}

Assistant:

bool Character::HasSpell(short spell)
{
	return (std::find_if(UTIL_RANGE(this->spells), [&](Character_Spell cs) { return cs.id == spell; }) != this->spells.end());
}